

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O3

void __thiscall FreqTable::initCum(FreqTable *this)

{
  double *pdVar1;
  double *freq;
  double *pdVar2;
  vector<double,_std::allocator<double>_> cumul;
  double sum;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  double local_30;
  
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_58,0x101);
  local_38 = 0.0;
  local_30 = 0.0;
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_58,
               (iterator)
               local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_30);
  }
  else {
    *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pdVar2 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    do {
      local_38 = local_38 + *pdVar2;
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  std::vector<double,_std::allocator<double>_>::operator=(&this->cumulative,&local_58);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FreqTable::initCum() {
    vector<double> cumul;
    cumul.reserve(257);
    double sum = 0;
    cumul.push_back(0);
    for (const auto &freq : frequencies) {
        sum += freq;
        cumul.push_back(sum);
    }
    cumulative = cumul;
}